

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O1

vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_> *
msgpack11::MsgPack::parse_multi
          (vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_> *__return_storage_ptr__,
          string *in,size_type *parser_stop_pos,string *err)

{
  MsgPackParser parser;
  string *local_58;
  size_type local_50;
  string *local_48;
  byte local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  local_50 = 0;
  local_40 = 0;
  *parser_stop_pos = 0;
  (__return_storage_ptr__->
  super__Vector_base<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (in->_M_string_length != 0) {
    local_58 = in;
    local_48 = err;
    do {
      anon_unknown_0::MsgPackParser::parse_msgpack
                ((MsgPackParser *)&stack0xffffffffffffffc8,(int)&local_58);
      std::vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_>::
      emplace_back<msgpack11::MsgPack>(__return_storage_ptr__,(MsgPack *)&stack0xffffffffffffffc8);
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
      }
      if (local_40 == 0) {
        *parser_stop_pos = local_50;
      }
    } while ((local_50 != in->_M_string_length) && ((local_40 & 1) == 0));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<MsgPack> MsgPack::parse_multi(const string &in,
                                     std::string::size_type &parser_stop_pos,
                                     string &err) {
    MsgPackParser parser { in, 0, err, false };
    parser_stop_pos = 0;
    vector<MsgPack> msgpack_vec;
    while (parser.i != in.size() && !parser.failed) {
        msgpack_vec.push_back(parser.parse_msgpack(0));
        if (!parser.failed)
            parser_stop_pos = parser.i;
    }
    return msgpack_vec;
}